

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-adapter.cpp
# Opt level: O0

bool __thiscall
llama_adapter_cvec::apply
          (llama_adapter_cvec *this,llama_model *model,float *data,size_t len,int32_t n_embd,
          int32_t il_start,int32_t il_end)

{
  value_type pgVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  reference ppgVar5;
  long lVar6;
  ulong in_RCX;
  long in_RDX;
  llama_model *in_RSI;
  llama_adapter_cvec *in_RDI;
  uint32_t in_R8D;
  int32_t in_R9D;
  int32_t in_stack_00000008;
  size_t off;
  size_t il;
  llama_hparams *hparams;
  ulong local_40;
  bool local_1;
  
  if (in_RDX == 0) {
    *(undefined4 *)
     &(((_Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)&in_RDI->layer_start)->
      _M_impl).super__Vector_impl_data._M_start = 0xffffffff;
    in_RDI->layer_end = -1;
    local_1 = true;
  }
  else if (in_R8D == (in_RSI->hparams).n_embd) {
    bVar2 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::empty
                      ((vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)in_RDI);
    if ((bVar2) && (uVar3 = init(in_RDI,in_RSI), (uVar3 & 1) == 0)) {
      local_1 = false;
    }
    else {
      in_RDI->layer_start = in_R9D;
      in_RDI->layer_end = in_stack_00000008;
      for (local_40 = 1; local_40 < (in_RSI->hparams).n_layer; local_40 = local_40 + 1) {
        lVar4 = (long)(int)in_R8D * (local_40 - 1);
        if ((ulong)(lVar4 + (int)in_R8D) <= in_RCX) {
          ppgVar5 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::operator[]
                              (&in_RDI->tensors,local_40);
          pgVar1 = *ppgVar5;
          ppgVar5 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::operator[]
                              (&in_RDI->tensors,local_40);
          lVar6 = ggml_element_size(*ppgVar5);
          ggml_backend_tensor_set(pgVar1,in_RDX + lVar4 * 4,0,(int)in_R8D * lVar6);
        }
      }
      local_1 = true;
    }
  }
  else {
    llama_log_internal(GGML_LOG_LEVEL_ERROR,"%s: control vector n_embd does not match model\n",
                       "apply");
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool llama_adapter_cvec::apply(
        const llama_model & model,
        const float * data,
        size_t len,
        int32_t n_embd,
        int32_t il_start,
        int32_t il_end) {
    const auto & hparams = model.hparams;

    if (data == nullptr) {
        // disable the current control vector (but leave allocated for later)
        layer_start = -1;
        layer_end   = -1;
        return true;
    }

    if (n_embd != (int) hparams.n_embd) {
        LLAMA_LOG_ERROR("%s: control vector n_embd does not match model\n", __func__);
        return false;
    }

    if (tensors.empty()) {
        if (!init(model)) {
            return false;
        }
    }

    layer_start = il_start;
    layer_end   = il_end;

    for (size_t il = 1; il < hparams.n_layer; il++) {
        assert(tensors[il] != nullptr);

        const size_t off = n_embd * (il - 1); // buffer doesn't have data for layer 0, since it's never present
        if (off + n_embd <= len) {
            ggml_backend_tensor_set(tensors[il], data + off, 0, n_embd * ggml_element_size(tensors[il]));
        }
    }

    return true;
}